

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this)

{
  Syntax SVar1;
  char *pcVar2;
  
  SVar1 = this->style->syntax;
  if (2 < SVar1 - MOIRA_MIT) {
    if (SVar1 != MOIRA) {
      return this;
    }
    pcVar2 = this->ptr;
    this->ptr = pcVar2 + 1;
    *pcVar2 = '.';
  }
  pcVar2 = this->ptr;
  this->ptr = pcVar2 + 1;
  *pcVar2 = 'w';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Szb<S>)
{
    switch (style.syntax) {

        case Syntax::MOIRA:

            *ptr++ = '.';
            [[fallthrough]];

        case Syntax::MOIRA_MIT:
       case Syntax::GNU:
        case Syntax::GNU_MIT:

            if constexpr (S == Byte) *ptr++ = 's';
            if constexpr (S == Word) *ptr++ = 'w';
            if constexpr (S == Long) *ptr++ = 'l';
            break;

        default:
            break;
    }

    return *this;
}